

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  int i;
  ulong uVar2;
  ImGuiContext *g;
  
  uVar1 = (ctx->Windows).Size;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    (ctx->Windows).Data[uVar2]->SettingsOffset = -1;
  }
  ImVector<char>::clear(&(ctx->SettingsWindows).Buf);
  return;
}

Assistant:

static void WindowSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
        g.Windows[i]->SettingsOffset = -1;
    g.SettingsWindows.clear();
}